

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

typed_value<std::vector<float,_std::allocator<float>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<float>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<float>_> *opt)

{
  element_type *peVar1;
  typed_value<std::vector<float,_std::allocator<float>_>,_char> *ptVar2;
  initializer_list<float> __l;
  allocator_type local_3d;
  element_type local_3c;
  _Vector_base<float,_std::allocator<float>_> local_38;
  
  ptVar2 = boost::program_options::value<std::vector<float,std::allocator<float>>>();
  peVar1 = (((opt->super___shared_ptr<VW::config::typed_option<float>,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->m_default_value).super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    local_3c = *peVar1;
    __l._M_len = 1;
    __l._M_array = &local_3c;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_38,__l,&local_3d);
    boost::program_options::typed_value<std::vector<float,_std::allocator<float>_>,_char>::
    default_value(ptVar2,(vector<float,_std::allocator<float>_> *)&local_38);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_38);
  }
  ptVar2 = add_notifier<float>(this,opt,ptVar2);
  ptVar2->m_composing = true;
  return ptVar2;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(std::shared_ptr<typed_option<T>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value({opt->default_value()});
  }

  return add_notifier(opt, value)->composing();
}